

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O2

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  internal *piVar1;
  FILE *__stream;
  bool bVar2;
  size_type sVar3;
  _Rb_tree_node_base *p_Var4;
  Message *this_00;
  int line_00;
  char *extraout_RDX;
  char *str;
  char *extraout_RDX_00;
  char *names;
  internal *piVar5;
  Message errors;
  string name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  uint local_b4;
  string local_b0;
  internal *local_90;
  internal *local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_50;
  
  piVar5 = (internal *)(registered_tests + -1);
  *this = (TypedTestCasePState)0x1;
  local_b4 = line;
  local_90 = (internal *)file;
  do {
    piVar1 = piVar5 + 1;
    piVar5 = piVar5 + 1;
    bVar2 = IsSpace((char)*piVar1);
  } while (bVar2);
  Message::Message((Message *)&local_c0);
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  str = extraout_RDX;
  local_88 = piVar5;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (piVar5 == (internal *)0x0) {
      for (p_Var4 = *(_Rb_tree_node_base **)(this + 0x20); line_00 = (int)registered_tests,
          p_Var4 != (_Rb_tree_node_base *)(this + 0x10);
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        std::__cxx11::string::string
                  ((string *)&local_b0,*(char **)(p_Var4 + 1),(allocator *)&local_50);
        sVar3 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_80,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        if (sVar3 == 0) {
          std::operator<<((ostream *)(local_c0.ptr_ + 0x10),"You forgot to list test ");
          this_00 = Message::operator<<((Message *)&local_c0,(char **)(p_Var4 + 1));
          Message::operator<<(this_00,(char (*) [3])0x135cc5);
        }
      }
      StringStreamToString(&local_b0,local_c0.ptr_);
      bVar2 = std::operator!=(&local_b0,"");
      piVar5 = local_88;
      __stream = _stderr;
      if (!bVar2) {
        std::__cxx11::string::~string((string *)&local_b0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_80);
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_c0);
        return (char *)piVar5;
      }
      FormatFileLocation_abi_cxx11_(&local_50,local_90,(char *)(ulong)local_b4,line_00);
      fprintf(__stream,"%s %s",local_50._M_dataplus._M_p,local_b0._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      fflush(_stderr);
      abort();
    }
    GetPrefixUntilComma_abi_cxx11_(&local_b0,piVar5,str);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_80,&local_b0);
    if (sVar3 == 0) {
      for (p_Var4 = *(_Rb_tree_node_base **)(this + 0x20);
          p_Var4 != (_Rb_tree_node_base *)(this + 0x10);
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        bVar2 = std::operator==(&local_b0,*(char **)(p_Var4 + 1));
        if (bVar2) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_80,&local_b0);
          goto LAB_0012caac;
        }
      }
      std::operator<<((ostream *)(local_c0.ptr_ + 0x10),"No test named ");
      std::operator<<((ostream *)(local_c0.ptr_ + 0x10),(string *)&local_b0);
      std::operator<<((ostream *)(local_c0.ptr_ + 0x10)," can be found in this test case.\n");
    }
    else {
      std::operator<<((ostream *)(local_c0.ptr_ + 0x10),"Test ");
      std::operator<<((ostream *)(local_c0.ptr_ + 0x10),(string *)&local_b0);
      std::operator<<((ostream *)(local_c0.ptr_ + 0x10)," is listed more than once.\n");
    }
LAB_0012caac:
    std::__cxx11::string::~string((string *)&local_b0);
    piVar5 = (internal *)SkipComma((char *)piVar5);
    str = extraout_RDX_00;
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<std::string> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const std::string name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}